

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O2

void __thiscall wasm::StringLifting::run(StringLifting *this,Module *module)

{
  byte *pbVar1;
  pointer puVar2;
  Global *pGVar3;
  pointer puVar4;
  Function *pFVar5;
  bool bVar6;
  uint x;
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *this_00;
  mapped_type *pmVar7;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  __position;
  size_t sVar8;
  __shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  size_type sVar10;
  IString *pIVar11;
  ostream *poVar12;
  Name *pNVar13;
  char *pcVar14;
  pointer puVar15;
  pointer puVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  string_view str;
  Name name;
  initializer_list<wasm::Type> types;
  initializer_list<wasm::Type> types_00;
  initializer_list<wasm::Type> types_01;
  initializer_list<wasm::Type> types_02;
  initializer_list<wasm::Type> types_03;
  initializer_list<wasm::Type> types_04;
  initializer_list<wasm::Type> types_05;
  Array local_438;
  undefined1 local_428 [8];
  vector<char,_std::allocator<char>_> copy;
  undefined1 local_2a0 [8];
  Name stringConstsModule;
  Type local_288;
  Type local_280;
  Type local_278;
  Type local_270;
  Type local_268;
  Type local_260;
  Type local_258;
  Name *local_250;
  Name *local_248;
  Name *local_240;
  Name *local_238;
  Name *local_230;
  undefined1 local_228 [8];
  StringApplier applier;
  Type TStack_78;
  undefined4 uStack_74;
  Type array16;
  Type TStack_48;
  Type refExtern;
  Type local_38;
  Type externref;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_428,"string-constants-module",
             (allocator<char> *)&stack0xffffffffffffffb8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff88,WasmStringConstsModule,(allocator<char> *)&local_38)
  ;
  Pass::getArgumentOrDefault
            ((string *)local_228,&this->super_Pass,(string *)local_428,
             (string *)&stack0xffffffffffffff88);
  IString::IString((IString *)local_2a0,(string *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string((string *)local_428);
  puVar2 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->importedStrings;
  bVar6 = false;
  for (puVar16 = (module->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar2; puVar16 = puVar16 + 1
      ) {
    pGVar3 = (puVar16->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    pcVar14 = *(char **)((long)&(pGVar3->super_Importable).module + 8);
    if ((pcVar14 != (char *)0x0) && (pcVar14 == (char *)stringConstsModule.super_IString.str._M_len)
       ) {
      _TStack_78 = *(pointer *)&(pGVar3->super_Importable).base.super_IString.str;
      array16.id = *(uintptr_t *)((long)&(pGVar3->super_Importable).base + 8);
      std::__cxx11::stringstream::stringstream((stringstream *)local_228);
      str._M_str = pcVar14;
      str._M_len = array16.id;
      bVar6 = String::convertWTF8ToWTF16
                        ((String *)
                         &applier.
                          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                          .super_Pass.runner,(ostream *)_TStack_78,str);
      if (!bVar6) {
        Fatal::Fatal((Fatal *)local_428);
        std::operator<<((ostream *)
                        &copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,"Bad string to lift: ");
        Fatal::operator<<((Fatal *)local_428,(Name *)&stack0xffffffffffffff88);
        Fatal::~Fatal((Fatal *)local_428);
      }
      std::__cxx11::stringbuf::str();
      IString::IString((IString *)&stack0xffffffffffffffb8,(string *)local_428);
      pmVar7 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,
                            (key_type *)
                            (puVar16->_M_t).
                            super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                            .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
      (pmVar7->super_IString).str._M_len = TStack_48.id;
      (pmVar7->super_IString).str._M_str = (char *)refExtern.id;
      std::__cxx11::string::~string((string *)local_428);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_228);
      bVar6 = true;
    }
  }
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<wasm::CustomSection*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>,__gnu_cxx::__ops::_Iter_pred<wasm::StringLifting::run(wasm::Module*)::_lambda(wasm::CustomSection&)_1_>>
                         ((module->customSections).
                          super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (module->customSections).
                          super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  if (__position._M_current !=
      (module->customSections).
      super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_428,&(__position._M_current)->data);
    TStack_78 = 3;
    array16.id = 0;
    json::Value::parse((Value *)&stack0xffffffffffffff88,(char *)local_428,WTF16);
    if (TStack_78 != Array) {
      Fatal::Fatal((Fatal *)local_228);
      Fatal::operator<<((Fatal *)local_228,
                        (char (*) [59])"StringLifting: string.const section should be a JSON array")
      ;
LAB_00b32205:
      Fatal::~Fatal((Fatal *)local_228);
    }
    puVar2 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (module->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar2;
        puVar16 = puVar16 + 1) {
      pGVar3 = (puVar16->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar3->super_Importable).module + 8) != (char *)0x0) {
        IString::IString((IString *)local_228,"string.const");
        if (*(_func_int ***)((long)&(pGVar3->super_Importable).module + 8) ==
            applier.
            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
            super_Pass._vptr_Pass) {
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_228,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &(((puVar16->_M_t).
                        super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->super_Importable
                      ).base,(allocator<char> *)&stack0xffffffffffffffb8);
          x = std::__cxx11::stoi((string *)local_228,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)local_228);
          sVar8 = json::Value::size((Value *)&stack0xffffffffffffff88);
          if (sVar8 <= x) {
            Fatal::Fatal((Fatal *)local_228);
            Fatal::operator<<((Fatal *)local_228,
                              (char (*) [49])"StringLifting: bad index in string.const section");
            goto LAB_00b32205;
          }
          p_Var9 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                   json::Value::operator[]((Value *)&stack0xffffffffffffff88,x);
          std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                     &stack0xffffffffffffffb8,p_Var9);
          if (*(int *)TStack_48.id != 0) {
            Fatal::Fatal((Fatal *)local_228);
            Fatal::operator<<((Fatal *)local_228,
                              (char (*) [58])
                              "StringLifting: string.const section entry is not a string");
            goto LAB_00b32205;
          }
          sVar10 = std::
                   _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::count(&this_00->_M_h,
                           (key_type *)
                           (puVar16->_M_t).
                           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                           .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
          if (sVar10 != 0) {
            Fatal::Fatal((Fatal *)local_228);
            Fatal::operator<<((Fatal *)local_228,
                              (char (*) [57])
                              "StringLifting: string.const section tramples other const");
            goto LAB_00b32205;
          }
          pIVar11 = json::Value::getIString((Value *)TStack_48.id);
          sVar8 = (pIVar11->str)._M_len;
          pcVar14 = (pIVar11->str)._M_str;
          pmVar7 = std::__detail::
                   _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_00,
                                (key_type *)
                                (puVar16->_M_t).
                                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
          (pmVar7->super_IString).str._M_len = sVar8;
          (pmVar7->super_IString).str._M_str = pcVar14;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&refExtern);
        }
      }
    }
    std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::erase
              (&module->customSections,(const_iterator)__position._M_current);
    json::Value::free((Value *)&stack0xffffffffffffff88,__position._M_current);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)local_428);
  }
  local_438.element.type.id = 2;
  local_438.element.packedType = i16;
  local_438.element.mutable_ = Mutable;
  HeapType::HeapType((HeapType *)&stringConstsModule.super_IString.str._M_str,&local_438);
  wasm::Type::Type((Type *)&stack0xffffffffffffff88,
                   (HeapType)stringConstsModule.super_IString.str._M_str,Nullable,Inexact);
  wasm::Type::Type(&stack0xffffffffffffffb8,(HeapType)0x8,NonNullable,Inexact);
  wasm::Type::Type(&local_38,(HeapType)0x8,Nullable,Inexact);
  puVar15 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_230 = &this->substringImport;
  local_238 = &this->charCodeAtImport;
  local_240 = &this->lengthImport;
  local_248 = &this->compareImport;
  local_250 = &this->equalsImport;
  do {
    if (puVar15 == puVar4) {
      if (bVar6) {
        run(wasm::Module*)::StringApplier::StringApplier(wasm::StringLifting_const__
                  ((WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                    *)local_228,this);
        WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>::run
                  ((WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                    *)local_228,(this->super_Pass).runner,module);
        Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::walkModuleCode
                  ((Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_> *)
                   ((long)&applier.
                           super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                           .super_Pass.passArg.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   + 0x20),module);
        pbVar1 = (byte *)((long)&(module->features).features + 1);
        *pbVar1 = *pbVar1 | 0x40;
        WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>::
        ~WalkerPass((WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                     *)local_228);
      }
      return;
    }
    pFVar5 = (puVar15->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pcVar14 = *(char **)((long)&(pFVar5->super_Importable).module + 8);
    if ((pcVar14 != (char *)0x0) && (pcVar14 == (char *)WasmStringsModule._8_8_)) {
      _local_428 = HeapType::getSignature(&pFVar5->type);
      pFVar5 = (puVar15->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      IString::IString((IString *)local_228,"fromCharCodeArray");
      if (*(_func_int ***)((long)&(pFVar5->super_Importable).base + 8) ==
          applier.
          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
          super_Pass._vptr_Pass) {
        local_228 = (undefined1  [8])_TStack_78;
        applier.
        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
        super_Pass._vptr_Pass = (_func_int **)0x2;
        applier.
        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
        super_Pass.runner = (PassRunner *)0x2;
        types._M_len = 3;
        types._M_array = (iterator)local_228;
        wasm::Type::Type(&local_288,types);
        if ((local_428 != (undefined1  [8])local_288.id) ||
           (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)TStack_48.id)) {
          Fatal::Fatal((Fatal *)local_228);
          std::operator<<((ostream *)
                          &applier.
                           super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                           .super_Pass.runner,"StringLifting: bad signature for fromCharCodeArray: "
                         );
          Fatal::operator<<((Fatal *)local_228,(Signature *)local_428);
          goto LAB_00b32205;
        }
        pFVar5 = (puVar15->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        uVar17 = *(undefined4 *)&(pFVar5->super_Importable).super_Named;
        uVar18 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 4);
        uVar19 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 8);
        uVar20 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 0xc);
        pNVar13 = &this->fromCharCodeArrayImport;
      }
      else {
        pFVar5 = (puVar15->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        IString::IString((IString *)local_228,"fromCodePoint");
        if (*(_func_int ***)((long)&(pFVar5->super_Importable).base + 8) ==
            applier.
            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
            super_Pass._vptr_Pass) {
          if ((local_428 != (undefined1  [8])0x2) ||
             (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)TStack_48.id)) {
            Fatal::Fatal((Fatal *)local_228);
            std::operator<<((ostream *)
                            &applier.
                             super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                             .super_Pass.runner,"StringLifting: bad signature for fromCodePoint: ");
            Fatal::operator<<((Fatal *)local_228,(Signature *)local_428);
            goto LAB_00b32205;
          }
          pFVar5 = (puVar15->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          uVar17 = *(undefined4 *)&(pFVar5->super_Importable).super_Named;
          uVar18 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 4);
          uVar19 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 8);
          uVar20 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 0xc);
          pNVar13 = &this->fromCodePointImport;
        }
        else {
          pFVar5 = (puVar15->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          IString::IString((IString *)local_228,"concat");
          if (*(_func_int ***)((long)&(pFVar5->super_Importable).base + 8) ==
              applier.
              super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
              .super_Pass._vptr_Pass) {
            local_228 = (undefined1  [8])local_38.id;
            applier.
            super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>.
            super_Pass._vptr_Pass = (_func_int **)local_38.id;
            types_00._M_len = 2;
            types_00._M_array = (iterator)local_228;
            wasm::Type::Type(&local_280,types_00);
            if ((local_428 != (undefined1  [8])local_280.id) ||
               (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start != (pointer)TStack_48.id)) {
              Fatal::Fatal((Fatal *)local_228);
              std::operator<<((ostream *)
                              &applier.
                               super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                               .super_Pass.runner,"StringLifting: bad signature for concta: ");
              Fatal::operator<<((Fatal *)local_228,(Signature *)local_428);
              goto LAB_00b32205;
            }
            pFVar5 = (puVar15->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            uVar17 = *(undefined4 *)&(pFVar5->super_Importable).super_Named;
            uVar18 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 4);
            uVar19 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 8);
            uVar20 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 0xc);
            pNVar13 = &this->concatImport;
          }
          else {
            pFVar5 = (puVar15->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            IString::IString((IString *)local_228,"intoCharCodeArray");
            if (*(_func_int ***)((long)&(pFVar5->super_Importable).base + 8) ==
                applier.
                super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                .super_Pass._vptr_Pass) {
              local_228 = (undefined1  [8])local_38.id;
              applier.
              super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
              .super_Pass._vptr_Pass = (_func_int **)_TStack_78;
              applier.
              super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
              .super_Pass.runner = (PassRunner *)0x2;
              types_01._M_len = 3;
              types_01._M_array = (iterator)local_228;
              wasm::Type::Type(&local_278,types_01);
              if ((local_428 != (undefined1  [8])local_278.id) ||
                 (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x2)) {
                Fatal::Fatal((Fatal *)local_228);
                std::operator<<((ostream *)
                                &applier.
                                 super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                 .super_Pass.runner,
                                "StringLifting: bad signature for intoCharCodeArray: ");
                Fatal::operator<<((Fatal *)local_228,(Signature *)local_428);
                goto LAB_00b32205;
              }
              pFVar5 = (puVar15->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
              uVar17 = *(undefined4 *)&(pFVar5->super_Importable).super_Named;
              uVar18 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 4);
              uVar19 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 8);
              uVar20 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 0xc);
              pNVar13 = &this->intoCharCodeArrayImport;
            }
            else {
              pFVar5 = (puVar15->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
              IString::IString((IString *)local_228,"equals");
              if (*(_func_int ***)((long)&(pFVar5->super_Importable).base + 8) ==
                  applier.
                  super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                  .super_Pass._vptr_Pass) {
                local_228 = (undefined1  [8])local_38.id;
                applier.
                super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                .super_Pass._vptr_Pass = (_func_int **)local_38.id;
                types_02._M_len = 2;
                types_02._M_array = (iterator)local_228;
                wasm::Type::Type(&local_270,types_02);
                if ((local_428 != (undefined1  [8])local_270.id) ||
                   (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x2)) {
                  Fatal::Fatal((Fatal *)local_228);
                  std::operator<<((ostream *)
                                  &applier.
                                   super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                   .super_Pass.runner,"StringLifting: bad signature for equals: ");
                  Fatal::operator<<((Fatal *)local_228,(Signature *)local_428);
                  goto LAB_00b32205;
                }
                pFVar5 = (puVar15->_M_t).
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                uVar17 = *(undefined4 *)&(pFVar5->super_Importable).super_Named;
                uVar18 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 4);
                uVar19 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 8);
                uVar20 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 0xc);
                pNVar13 = local_250;
              }
              else {
                pFVar5 = (puVar15->_M_t).
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                IString::IString((IString *)local_228,"compare");
                if (*(_func_int ***)((long)&(pFVar5->super_Importable).base + 8) ==
                    applier.
                    super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                    .super_Pass._vptr_Pass) {
                  local_228 = (undefined1  [8])local_38.id;
                  applier.
                  super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                  .super_Pass._vptr_Pass = (_func_int **)local_38.id;
                  types_03._M_len = 2;
                  types_03._M_array = (iterator)local_228;
                  wasm::Type::Type(&local_268,types_03);
                  if ((local_428 != (undefined1  [8])local_268.id) ||
                     (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x2)) {
                    Fatal::Fatal((Fatal *)local_228);
                    std::operator<<((ostream *)
                                    &applier.
                                     super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                     .super_Pass.runner,"StringLifting: bad signature for compare: "
                                   );
                    Fatal::operator<<((Fatal *)local_228,(Signature *)local_428);
                    goto LAB_00b32205;
                  }
                  pFVar5 = (puVar15->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                  uVar17 = *(undefined4 *)&(pFVar5->super_Importable).super_Named;
                  uVar18 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 4);
                  uVar19 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 8);
                  uVar20 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 0xc);
                  pNVar13 = local_248;
                }
                else {
                  pFVar5 = (puVar15->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                  IString::IString((IString *)local_228,"length");
                  if (*(_func_int ***)((long)&(pFVar5->super_Importable).base + 8) ==
                      applier.
                      super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                      .super_Pass._vptr_Pass) {
                    if ((local_428 != (undefined1  [8])local_38.id) ||
                       (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x2)) {
                      Fatal::Fatal((Fatal *)local_228);
                      std::operator<<((ostream *)
                                      &applier.
                                       super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                       .super_Pass.runner,
                                      "StringLifting: bad signature for length: ");
                      Fatal::operator<<((Fatal *)local_228,(Signature *)local_428);
                      goto LAB_00b32205;
                    }
                    pFVar5 = (puVar15->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                    uVar17 = *(undefined4 *)&(pFVar5->super_Importable).super_Named;
                    uVar18 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 4);
                    uVar19 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 8);
                    uVar20 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 0xc);
                    pNVar13 = local_240;
                  }
                  else {
                    pFVar5 = (puVar15->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                    IString::IString((IString *)local_228,"charCodeAt");
                    if (*(_func_int ***)((long)&(pFVar5->super_Importable).base + 8) ==
                        applier.
                        super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                        .super_Pass._vptr_Pass) {
                      local_228 = (undefined1  [8])local_38.id;
                      applier.
                      super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                      .super_Pass._vptr_Pass = (_func_int **)0x2;
                      types_04._M_len = 2;
                      types_04._M_array = (iterator)local_228;
                      wasm::Type::Type(&local_260,types_04);
                      if ((local_428 != (undefined1  [8])local_260.id) ||
                         (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x2)) {
                        Fatal::Fatal((Fatal *)local_228);
                        std::operator<<((ostream *)
                                        &applier.
                                         super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                         .super_Pass.runner,
                                        "StringLifting: bad signature for charCodeAt: ");
                        Fatal::operator<<((Fatal *)local_228,(Signature *)local_428);
                        goto LAB_00b32205;
                      }
                      pFVar5 = (puVar15->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                      uVar17 = *(undefined4 *)&(pFVar5->super_Importable).super_Named;
                      uVar18 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 4);
                      uVar19 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 8);
                      uVar20 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 0xc);
                      pNVar13 = local_238;
                    }
                    else {
                      pFVar5 = (puVar15->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                      IString::IString((IString *)local_228,"substring");
                      if (*(_func_int ***)((long)&(pFVar5->super_Importable).base + 8) !=
                          applier.
                          super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                          .super_Pass._vptr_Pass) {
                        poVar12 = std::operator<<((ostream *)&std::cerr,
                                                  "warning: unknown strings import: ");
                        pFVar5 = (puVar15->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                        name.super_IString.str._M_str = (char *)pFVar5;
                        name.super_IString.str._M_len =
                             (size_t)*(char **)((long)&(pFVar5->super_Importable).base + 8);
                        poVar12 = wasm::operator<<((wasm *)poVar12,
                                                   *(ostream **)
                                                    &(pFVar5->super_Importable).base.super_IString.
                                                     str,name);
                        std::operator<<(poVar12,'\n');
                        goto LAB_00b31e75;
                      }
                      local_228 = (undefined1  [8])local_38.id;
                      applier.
                      super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                      .super_Pass._vptr_Pass = (_func_int **)0x2;
                      applier.
                      super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                      .super_Pass.runner = (PassRunner *)0x2;
                      types_05._M_len = 3;
                      types_05._M_array = (iterator)local_228;
                      wasm::Type::Type(&local_258,types_05);
                      if ((local_428 != (undefined1  [8])local_258.id) ||
                         (copy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)TStack_48.id)) {
                        Fatal::Fatal((Fatal *)local_228);
                        std::operator<<((ostream *)
                                        &applier.
                                         super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                                         .super_Pass.runner,
                                        "StringLifting: bad signature for substring: ");
                        Fatal::operator<<((Fatal *)local_228,(Signature *)local_428);
                        goto LAB_00b32205;
                      }
                      pFVar5 = (puVar15->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                      uVar17 = *(undefined4 *)&(pFVar5->super_Importable).super_Named;
                      uVar18 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 4);
                      uVar19 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 8);
                      uVar20 = *(undefined4 *)((long)&(pFVar5->super_Importable).super_Named + 0xc);
                      pNVar13 = local_230;
                    }
                  }
                }
              }
            }
          }
        }
      }
      *(undefined4 *)&(pNVar13->super_IString).str._M_len = uVar17;
      *(undefined4 *)((long)&(pNVar13->super_IString).str._M_len + 4) = uVar18;
      *(undefined4 *)&(pNVar13->super_IString).str._M_str = uVar19;
      *(undefined4 *)((long)&(pNVar13->super_IString).str._M_str + 4) = uVar20;
      bVar6 = true;
    }
LAB_00b31e75:
    puVar15 = puVar15 + 1;
  } while( true );
}

Assistant:

void run(Module* module) override {
    // Whether we found any work to do.
    bool found = false;

    // Imported string constants look like
    //
    //   (import "\'" "bar" (global $string.bar.internal.name (ref extern)))
    //
    // That is, they are imported from module "'" and the basename is the
    // actual string. Find them all so we can apply them.
    Name stringConstsModule =
      getArgumentOrDefault("string-constants-module", WasmStringConstsModule);
    for (auto& global : module->globals) {
      if (!global->imported()) {
        continue;
      }
      if (global->module == stringConstsModule) {
        // Encode from WTF-8 to WTF-16.
        auto wtf8 = global->base;
        std::stringstream wtf16;
        bool valid = String::convertWTF8ToWTF16(wtf16, wtf8.str);
        if (!valid) {
          Fatal() << "Bad string to lift: " << wtf8;
        }
        importedStrings[global->name] = wtf16.str();
        found = true;
      }
    }

    // Imported strings may also be found in the string section.
    auto stringSectionIter = std::find_if(
      module->customSections.begin(),
      module->customSections.end(),
      [&](CustomSection& section) { return section.name == "string.consts"; });
    if (stringSectionIter != module->customSections.end()) {
      // We found the string consts section. Parse it.
      auto& section = *stringSectionIter;
      auto copy = section.data;
      json::Value array;
      array.parse(copy.data(), json::Value::WTF16);
      if (!array.isArray()) {
        Fatal() << "StringLifting: string.const section should be a JSON array";
      }

      // We have the array of constants from the section. Find globals that
      // refer to it.
      for (auto& global : module->globals) {
        if (!global->imported() || global->module != "string.const") {
          continue;
        }
        // The index in the array is the basename.
        Index index = std::stoi(std::string(global->base.str));
        if (index >= array.size()) {
          Fatal() << "StringLifting: bad index in string.const section";
        }
        auto item = array[index];
        if (!item->isString()) {
          Fatal()
            << "StringLifting: string.const section entry is not a string";
        }
        if (importedStrings.count(global->name)) {
          Fatal() << "StringLifting: string.const section tramples other const";
        }
        importedStrings[global->name] = item->getIString();
      }

      // Remove the custom section: After lifting it has no purpose (and could
      // cause problems with repeated lifting/lowering).
      module->customSections.erase(stringSectionIter);
    }

    auto array16 = Type(Array(Field(Field::i16, Mutable)), Nullable);
    auto refExtern = Type(HeapType::ext, NonNullable);
    auto externref = Type(HeapType::ext, Nullable);
    auto i32 = Type::i32;

    // Find imported string functions.
    for (auto& func : module->functions) {
      if (!func->imported() || func->module != WasmStringsModule) {
        continue;
      }
      auto sig = func->type.getSignature();
      if (func->base == "fromCharCodeArray") {
        if (sig != Signature({array16, i32, i32}, refExtern)) {
          Fatal() << "StringLifting: bad signature for fromCharCodeArray: "
                  << sig;
        }
        fromCharCodeArrayImport = func->name;
        found = true;
      } else if (func->base == "fromCodePoint") {
        if (sig != Signature(i32, refExtern)) {
          Fatal() << "StringLifting: bad signature for fromCodePoint: " << sig;
        }
        fromCodePointImport = func->name;
        found = true;
      } else if (func->base == "concat") {
        if (sig != Signature({externref, externref}, refExtern)) {
          Fatal() << "StringLifting: bad signature for concta: " << sig;
        }
        concatImport = func->name;
        found = true;
      } else if (func->base == "intoCharCodeArray") {
        if (sig != Signature({externref, array16, i32}, i32)) {
          Fatal() << "StringLifting: bad signature for intoCharCodeArray: "
                  << sig;
        }
        intoCharCodeArrayImport = func->name;
        found = true;
      } else if (func->base == "equals") {
        if (sig != Signature({externref, externref}, i32)) {
          Fatal() << "StringLifting: bad signature for equals: " << sig;
        }
        equalsImport = func->name;
        found = true;
      } else if (func->base == "compare") {
        if (sig != Signature({externref, externref}, i32)) {
          Fatal() << "StringLifting: bad signature for compare: " << sig;
        }
        compareImport = func->name;
        found = true;
      } else if (func->base == "length") {
        if (sig != Signature({externref}, i32)) {
          Fatal() << "StringLifting: bad signature for length: " << sig;
        }
        lengthImport = func->name;
        found = true;
      } else if (func->base == "charCodeAt") {
        if (sig != Signature({externref, i32}, i32)) {
          Fatal() << "StringLifting: bad signature for charCodeAt: " << sig;
        }
        charCodeAtImport = func->name;
        found = true;
      } else if (func->base == "substring") {
        if (sig != Signature({externref, i32, i32}, refExtern)) {
          Fatal() << "StringLifting: bad signature for substring: " << sig;
        }
        substringImport = func->name;
        found = true;
      } else {
        std::cerr << "warning: unknown strings import: " << func->base << '\n';
      }
    }

    if (!found) {
      // Nothing to do.
      return;
    }

    struct StringApplier : public WalkerPass<PostWalker<StringApplier>> {
      bool isFunctionParallel() override { return true; }

      const StringLifting& parent;

      StringApplier(const StringLifting& parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<StringApplier>(parent);
      }

      bool modified = false;

      void visitGlobalGet(GlobalGet* curr) {
        // Replace global.gets of imported strings with string.const.
        auto iter = parent.importedStrings.find(curr->name);
        if (iter != parent.importedStrings.end()) {
          auto wtf16 = iter->second;
          replaceCurrent(Builder(*getModule()).makeStringConst(wtf16.str));
          modified = true;
        }
      }

      void visitCall(Call* curr) {
        // Replace calls of imported string methods with stringref operations.
        if (curr->target == parent.fromCharCodeArrayImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringNew(StringNewWTF16Array,
                                          curr->operands[0],
                                          curr->operands[1],
                                          curr->operands[2]));
        } else if (curr->target == parent.fromCodePointImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringNew(StringNewFromCodePoint, curr->operands[0]));
        } else if (curr->target == parent.concatImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringConcat(curr->operands[0], curr->operands[1]));
        } else if (curr->target == parent.intoCharCodeArrayImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEncode(StringEncodeWTF16Array,
                                             curr->operands[0],
                                             curr->operands[1],
                                             curr->operands[2]));
        } else if (curr->target == parent.equalsImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEq(StringEqEqual,
                                         curr->operands[0],
                                         curr->operands[1]));
        } else if (curr->target == parent.compareImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEq(StringEqCompare,
                                         curr->operands[0],
                                         curr->operands[1]));
        } else if (curr->target == parent.lengthImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringMeasure(StringMeasureWTF16, curr->operands[0]));
        } else if (curr->target == parent.charCodeAtImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringWTF16Get(curr->operands[0], curr->operands[1]));
        } else if (curr->target == parent.substringImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringSliceWTF(curr->operands[0],
                                               curr->operands[1],
                                               curr->operands[2]));
        }
      }

      void visitFunction(Function* curr) {
        // If we made modifications then we need to refinalize, as we replace
        // externrefs with stringrefs, a subtype.
        if (modified) {
          ReFinalize().walkFunctionInModule(curr, getModule());
        }
      }
    };

    StringApplier applier(*this);
    applier.run(getPassRunner(), module);
    applier.walkModuleCode(module);

    // TODO: Add casts. We generate new string.* instructions, and all their
    //       string inputs should be stringref, not externref, but we have not
    //       converted all externrefs to stringrefs (since some externrefs might
    //       be something else). It is not urgent to fix this as the validator
    //       accepts externrefs there atm, and since toolchains will lower
    //       strings out at the end anyhow (which would remove such casts). Note
    //       that if we add a type import for stringref then this problem would
    //       become a lot simpler (we'd convert that type to stringref).

    // Enable the feature so the module validates.
    module->features.enable(FeatureSet::Strings);
  }